

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::getTransitionMatrix
          (BeagleCPUImpl<float,_1,_0> *this,int matrixIndex,double *outMatrix)

{
  float *pfVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  float *pfVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  
  iVar3 = this->kCategoryCount;
  if (0 < iVar3) {
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    iVar16 = 0;
    pfVar14 = this->gTransitionMatrices[matrixIndex];
    iVar4 = this->kStateCount;
    iVar5 = this->kTransPaddedStateCount;
    auVar20 = vpbroadcastq_avx512f();
    do {
      if (0 < iVar4) {
        iVar17 = 0;
        do {
          uVar15 = 0;
          do {
            auVar21 = vpbroadcastq_avx512f();
            auVar21 = vporq_avx512f(auVar21,auVar19);
            uVar13 = vpcmpuq_avx512f(auVar21,auVar20,2);
            pfVar1 = pfVar14 + uVar15;
            auVar18._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * (int)pfVar1[1];
            auVar18._0_4_ = (uint)((byte)uVar13 & 1) * (int)*pfVar1;
            auVar18._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * (int)pfVar1[2];
            auVar18._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * (int)pfVar1[3];
            auVar18._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * (int)pfVar1[4];
            auVar18._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * (int)pfVar1[5];
            auVar18._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * (int)pfVar1[6];
            auVar18._28_4_ = (uint)(byte)(uVar13 >> 7) * (int)pfVar1[7];
            auVar21 = vcvtps2pd_avx512f(auVar18);
            pdVar2 = outMatrix + uVar15;
            bVar6 = (bool)((byte)uVar13 & 1);
            bVar7 = (bool)((byte)(uVar13 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar13 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar13 >> 3) & 1);
            bVar10 = (bool)((byte)(uVar13 >> 4) & 1);
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            bVar12 = (bool)((byte)(uVar13 >> 6) & 1);
            *pdVar2 = (double)((ulong)bVar6 * auVar21._0_8_ | (ulong)!bVar6 * (long)*pdVar2);
            pdVar2[1] = (double)((ulong)bVar7 * auVar21._8_8_ | (ulong)!bVar7 * (long)pdVar2[1]);
            pdVar2[2] = (double)((ulong)bVar8 * auVar21._16_8_ | (ulong)!bVar8 * (long)pdVar2[2]);
            pdVar2[3] = (double)((ulong)bVar9 * auVar21._24_8_ | (ulong)!bVar9 * (long)pdVar2[3]);
            pdVar2[4] = (double)((ulong)bVar10 * auVar21._32_8_ | (ulong)!bVar10 * (long)pdVar2[4]);
            pdVar2[5] = (double)((ulong)bVar11 * auVar21._40_8_ | (ulong)!bVar11 * (long)pdVar2[5]);
            pdVar2[6] = (double)((ulong)bVar12 * auVar21._48_8_ | (ulong)!bVar12 * (long)pdVar2[6]);
            pdVar2[7] = (double)((uVar13 >> 7) * auVar21._56_8_ |
                                (ulong)!SUB81(uVar13 >> 7,0) * (long)pdVar2[7]);
            uVar15 = uVar15 + 8;
          } while ((iVar4 + 7U & 0xfffffff8) != uVar15);
          pfVar14 = pfVar14 + iVar5;
          outMatrix = outMatrix + iVar4;
          iVar17 = iVar17 + 1;
        } while (iVar17 != iVar4);
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 != iVar3);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getTransitionMatrix(int matrixIndex,
                                                 double* outMatrix) {
    // TODO Test with multiple rate categories
if (T_PAD != 0) {
    double* offsetOutMatrix = outMatrix;
    REALTYPE* offsetBeagleMatrix = gTransitionMatrices[matrixIndex];
    for(int i = 0; i < kCategoryCount; i++) {
        for(int j = 0; j < kStateCount; j++) {
            beagleMemCpy(offsetOutMatrix,offsetBeagleMatrix,kStateCount);
            offsetBeagleMatrix += kTransPaddedStateCount; // Skip padding
            offsetOutMatrix += kStateCount;
        }
    }
} else {
    beagleMemCpy(outMatrix,gTransitionMatrices[matrixIndex],
            kMatrixSize * kCategoryCount);
}
    return BEAGLE_SUCCESS;
}